

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testInvalidExpandDims1(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  NeuralNetwork *pNVar6;
  NeuralNetworkLayer *this;
  Tensor *pTVar7;
  ExpandDimsLayerParams *this_00;
  ostream *poVar8;
  Model m;
  Result res;
  
  CoreML::Specification::Model::Model(&m);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"A");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"B");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  pNVar6 = CoreML::Specification::Model::mutable_neuralnetwork(&m);
  pNVar6->arrayinputshapemapping_ = 1;
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar6->layers_);
  CoreML::Specification::NeuralNetworkLayer::set_name(this,"ED");
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"B");
  pTVar7 = google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::Add
                     (&this->inputtensor_);
  pTVar7->rank_ = 1;
  pTVar7 = google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::Add
                     (&this->outputtensor_);
  pTVar7->rank_ = 3;
  this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_expanddims(this);
  CoreML::Specification::ExpandDimsLayerParams::add_axes(this_00,-1);
  CoreML::validate<(MLModelType)500>(&res,&m);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x12f4);
    poVar8 = std::operator<<(poVar8,": error: ");
    poVar8 = std::operator<<(poVar8,"!((res).good())");
    poVar8 = std::operator<<(poVar8," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m);
  return (uint)bVar1;
}

Assistant:

int testInvalidExpandDims1() {
    /*
     A -> expand dims -> B
     shape of A: (2)
     shape of B: (2, 1, 1)
     axes parameter = [-1]
     */
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(2);
    
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    auto *shape_out = out->mutable_type()->mutable_multiarraytype();
    shape_out->add_shape(2);
    shape_out->add_shape(1);
    shape_out->add_shape(1);
    
    auto *nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    
    auto *l = nn->add_layers();
    l->set_name("ED");
    l->add_input("A");
    l->add_output("B");
    l->add_inputtensor()->set_rank(1);
    l->add_outputtensor()->set_rank(3);
    auto *params = l->mutable_expanddims();
    params->add_axes(-1);
    
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}